

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O1

void __thiscall
icu_63::SpoofImpl::addScriptChars
          (SpoofImpl *this,char *locale,UnicodeSet *allowedChars,UErrorCode *status)

{
  uint uVar1;
  ulong uVar2;
  UnicodeSet tmpSet;
  UScriptCode scripts [30];
  UnicodeSet local_100;
  UScriptCode local_a8 [30];
  
  uVar1 = uscript_getCode_63(locale,local_a8,0x1e,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (*status == U_USING_DEFAULT_WARNING) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeSet::UnicodeSet(&local_100);
      if (0 < (int)uVar1) {
        uVar2 = 0;
        do {
          UnicodeSet::applyIntPropertyValue(&local_100,UCHAR_SCRIPT,local_a8[uVar2],status);
          UnicodeSet::addAll(allowedChars,&local_100);
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      UnicodeSet::~UnicodeSet(&local_100);
    }
  }
  return;
}

Assistant:

void SpoofImpl::addScriptChars(const char *locale, UnicodeSet *allowedChars, UErrorCode &status) {
    UScriptCode scripts[30];

    int32_t numScripts = uscript_getCode(locale, scripts, UPRV_LENGTHOF(scripts), &status);
    if (U_FAILURE(status)) {
        return;
    }
    if (status == U_USING_DEFAULT_WARNING) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    UnicodeSet tmpSet;
    int32_t    i;
    for (i=0; i<numScripts; i++) {
        tmpSet.applyIntPropertyValue(UCHAR_SCRIPT, scripts[i], status);
        allowedChars->addAll(tmpSet);
    }
}